

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O2

int genaInitNotifyExt(UpnpDevice_Handle device_handle,char *UDN,char *servId,IXML_Document *PropSet,
                     char *sid)

{
  uint uVar1;
  char *propertySet;
  int DbgLineNo;
  
  uVar1 = 0;
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x2d4,"GENA BEGIN INITIAL NOTIFY EXT\n");
  if (PropSet == (IXML_Document *)0x0) {
    DbgLineNo = 0x2d8;
  }
  else {
    propertySet = (char *)ixmlPrintNode(PropSet);
    if (propertySet == (char *)0x0) {
      DbgLineNo = 0x2df;
      uVar1 = 0xffffff9b;
    }
    else {
      DbgLineNo = 0;
      UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x2e6,
                 "GENERATED PROPERTY SET IN INIT EXT NOTIFY: %s\n",propertySet);
      uVar1 = genaInitNotifyCommon(device_handle,UDN,servId,propertySet,sid);
    }
  }
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",DbgLineNo,
             "GENA END INITIAL NOTIFY EXT, ret = %d\n",(ulong)uVar1);
  return uVar1;
}

Assistant:

int genaInitNotifyExt(UpnpDevice_Handle device_handle,
	char *UDN,
	char *servId,
	IXML_Document *PropSet,
	const Upnp_SID sid)
{
	int ret = GENA_SUCCESS;
	int line = 0;

	DOMString propertySet = NULL;

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"GENA BEGIN INITIAL NOTIFY EXT\n");

	if (PropSet == 0) {
		line = __LINE__;
		ret = GENA_SUCCESS;
		goto ExitFunction;
	}

	propertySet = ixmlPrintNode((IXML_Node *)PropSet);
	if (propertySet == NULL) {
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto ExitFunction;
	}
	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"GENERATED PROPERTY SET IN INIT EXT NOTIFY: %s\n",
		propertySet);

	ret = genaInitNotifyCommon(
		device_handle, UDN, servId, propertySet, sid);

ExitFunction:

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		line,
		"GENA END INITIAL NOTIFY EXT, ret = %d\n",
		ret);

	return ret;
}